

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::num_suffix(sequence *__return_storage_ptr__,spec *s)

{
  anon_class_8_1_54a39813 graph;
  anon_class_8_1_54a39813 non_digit_graph;
  repeat_at_least rStack_108;
  anon_class_8_1_54a39813 local_f0;
  character local_e8;
  character local_d8;
  either local_c8;
  either local_a8;
  sequence local_88;
  either local_68;
  either local_48;
  anon_class_8_1_54a39813 local_28;
  
  local_d8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045b940;
  local_d8.value_ = '_';
  local_f0.s = s;
  local_28.s = s;
  num_suffix::anon_class_8_1_54a39813::operator()(&local_48,&local_28);
  local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045b940;
  local_e8.value_ = '_';
  num_suffix::anon_class_8_1_54a39813::operator()(&local_a8,&local_f0);
  sequence::sequence<toml::detail::character,toml::detail::either>(&local_88,&local_e8,&local_a8);
  num_suffix::anon_class_8_1_54a39813::operator()(&local_c8,&local_f0);
  either::either<toml::detail::sequence,toml::detail::either>(&local_68,&local_88,&local_c8);
  repeat_at_least::repeat_at_least<toml::detail::either>(&rStack_108,0,&local_68);
  sequence::sequence<toml::detail::character,toml::detail::either,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_d8,&local_48,&rStack_108);
  if (rStack_108.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        rStack_108.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  rStack_108.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_68.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_c8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_88.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_a8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_48.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence num_suffix(const spec& s)
{
    const auto non_digit_graph = [&s]() {
        return either(
            alpha(s),
            non_ascii(s)
        );
    };
    const auto graph = [&s]() {
        return either(
            alpha(s),
            digit(s),
            non_ascii(s)
        );
    };

    return sequence(
            character(char_type('_')),
            non_digit_graph(),
            repeat_at_least(0,
                either(
                    sequence(character(char_type('_')), graph()),
                    graph()
                )
            )
        );
}